

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg * __thiscall
fmt::v10::basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::get
          (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *this,int id
          )

{
  bool bVar1;
  int iVar2;
  type tVar3;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *pvVar4;
  int in_EDX;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *in_RSI;
  format_arg *in_RDI;
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>
  *in_stack_ffffffffffffffc8;
  format_arg *this_00;
  
  this_00 = in_RDI;
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::basic_format_arg
            (in_stack_ffffffffffffffc8);
  bVar1 = is_packed(in_RSI);
  if (bVar1) {
    if (in_EDX < 0xf) {
      tVar3 = type(in_RSI,in_EDX);
      in_RDI->type_ = tVar3;
      if (in_RDI->type_ != none_type) {
        pvVar4 = (in_RSI->field_1).values_;
        (in_RDI->value_).field_0.long_long_value = pvVar4[in_EDX].field_0.long_long_value;
        (in_RDI->value_).field_0.string.size = pvVar4[in_EDX].field_0.string.size;
      }
    }
  }
  else {
    iVar2 = max_size((basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *
                     )this_00);
    if (in_EDX < iVar2) {
      pvVar4 = (in_RSI->field_1).values_ + (long)in_EDX * 2;
      (in_RDI->value_).field_0.long_long_value = (pvVar4->field_0).long_long_value;
      (in_RDI->value_).field_0.string.size = (pvVar4->field_0).string.size;
      in_RDI->type_ = pvVar4[1].field_0.int_value;
    }
  }
  return this_00;
}

Assistant:

FMT_CONSTEXPR auto get(int id) const -> format_arg {
    format_arg arg;
    if (!is_packed()) {
      if (id < max_size()) arg = args_[id];
      return arg;
    }
    if (id >= detail::max_packed_args) return arg;
    arg.type_ = type(id);
    if (arg.type_ == detail::type::none_type) return arg;
    arg.value_ = values_[id];
    return arg;
  }